

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O2

void __thiscall PrintLanguage::opBinary(PrintLanguage *this,OpToken *tok,PcodeOp *op)

{
  LowlevelError *this_00;
  allocator local_39;
  string local_38;
  
  if ((this->mods >> 0xd & 1) != 0) {
    tok = tok->negate;
    this->mods = this->mods & 0xffffdfff;
    if (tok == (OpToken *)0x0) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_38,"Could not find fliptoken",&local_39);
      LowlevelError::LowlevelError(this_00,&local_38);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  pushOp(this,tok,op);
  pushVnImplied(this,(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                     super__Vector_impl_data._M_start[1],op,this->mods);
  pushVnImplied(this,*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_start,op,this->mods);
  return;
}

Assistant:

void PrintLanguage::opBinary(const OpToken *tok,const PcodeOp *op)

{
  if (isSet(negatetoken)) {
    tok = tok->negate;
    unsetMod(negatetoken);
    if (tok == (const OpToken *)0)
      throw LowlevelError("Could not find fliptoken");
  }
  pushOp(tok,op);		// Push on reverse polish notation
  // implied vn's pushed on in reverse order for efficiency
  // see PrintLanguage::pushVnImplied
  pushVnImplied(op->getIn(1),op,mods);
  pushVnImplied(op->getIn(0),op,mods);
}